

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestRequiredNoMaskMulti::Clear(TestRequiredNoMaskMulti *this)

{
  if ((undefined1  [36])((undefined1  [36])this->field_0 & (undefined1  [36])0x7f) !=
      (undefined1  [36])0x0) {
    *(undefined8 *)((long)&this->field_0 + 8) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x10) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x18) = 0;
    (this->field_0)._impl_.required_enum_1_ = 4;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestRequiredNoMaskMulti::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestRequiredNoMaskMulti)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    ::memset(&_impl_.required_enum_2_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.required_fixed32_80_) -
        reinterpret_cast<char*>(&_impl_.required_enum_2_)) + sizeof(_impl_.required_fixed32_80_));
    _impl_.required_enum_1_ = 4;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}